

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolyVertexClipTestGroup::init
          (PolyVertexClipTestGroup *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  Context *pCVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  PolyVertexClipTestGroup *pPVar10;
  int i;
  uint uVar11;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  long lVar12;
  long *plVar13;
  TriangleCaseBase *pTVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long sqSum;
  long *plVar18;
  long lVar19;
  int i_15;
  int iVar20;
  ulong uVar21;
  int *piVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  undefined1 extraout_var [12];
  float extraout_XMM0_Dd;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  float fVar31;
  float fVar32;
  Vector<int,_3> res_6;
  Vector<int,_3> res_9;
  Vec3 r2;
  Vector<long,_3> res_2;
  Vector<long,_3> res_1;
  Vector<long,_3> normalDir;
  IVec3 r0;
  TriangleData triangle;
  Vector<long,_3> res_4;
  IVec3 r2_1;
  IVec3 r1;
  string name;
  Vector<long,_3> res_3;
  Random rnd;
  undefined8 local_498;
  undefined8 uStack_490;
  long local_488;
  long lStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  long local_468;
  long lStack_460;
  undefined8 local_458;
  ulong local_450;
  long local_448;
  long lStack_440;
  undefined1 local_438 [16];
  long local_428;
  long lStack_420;
  undefined1 local_418 [16];
  long local_408;
  long lStack_400;
  undefined8 local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  undefined8 local_3d8;
  int local_3d0;
  TriangleData local_3c8;
  TriangleData local_368;
  undefined1 *local_300;
  PolyVertexClipTestGroup *local_2f8;
  undefined1 *local_2f0;
  TriangleData local_2e8;
  undefined8 local_288;
  float afStack_280 [2];
  undefined8 local_278;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  float fStack_260;
  float fStack_25c;
  float local_258;
  Vec4 local_248;
  long local_238;
  long lStack_230;
  TestNode *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f0;
  ulong local_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  TestNode *local_180;
  deRandom local_178;
  undefined8 local_168;
  int iStack_160;
  undefined1 auStack_15c [4];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_168 = 0xffffffff;
  _iStack_160 = 0x100000000;
  local_158 = 0;
  uStack_150 = 0x100000000;
  local_148 = 0;
  uStack_140 = 0xffffffff;
  local_138 = 0;
  uStack_130 = 1;
  local_128 = 0xffffffff00000000;
  uStack_120 = 0xffffffffffffffff;
  local_118 = 0x100000000;
  uStack_110 = 0xffffffff;
  local_108 = 0x100000001;
  uStack_100 = 0xffffffff00000000;
  local_f8 = 1;
  uStack_f0 = 0xffffffff;
  local_e8 = 0x1ffffffff;
  uStack_e0 = 0xffffffff00000000;
  local_d8 = 1;
  uStack_d0 = 0xffffffff00000001;
  local_c8 = 0x100000000;
  uStack_c0 = 0xffffffff00000000;
  local_b8 = 0xffffffff;
  uStack_b0 = 0xffffffff00000001;
  local_a8 = 0x100000000;
  uStack_a0 = 1;
  local_98 = 0x1ffffffff;
  uStack_90 = 0xffffffffffffffff;
  local_88 = 0x100000001;
  uStack_80 = 0x1ffffffff;
  local_78 = 0x100000001;
  uStack_70 = 0xffffffff00000001;
  local_68 = 0x100000001;
  uStack_60 = 0xffffffffffffffff;
  local_58 = 0x1ffffffff;
  uStack_50 = 0xffffffffffffffff;
  local_48 = 0x100000001;
  uStack_40 = 0xffffffffffffffff;
  local_38 = 0xffffffff00000001;
  deRandom_init(&local_178,0xabcdef);
  node = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar2->m_testCtx,"clip_one","Clip one vertex");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  node[1]._vptr_TestNode = (_func_int **)pCVar2;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar2->m_testCtx,"clip_two","Clip two vertices");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar2;
  node_01 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar2->m_testCtx,"clip_three","Clip three vertices");
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  node_01[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,node);
  local_220 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_2f8 = this;
  local_180 = node_01;
  tcu::TestNode::addChild((TestNode *)this,node_01);
  lVar23 = 0;
  do {
    local_368.c2.m_data[0] = deRandom_getFloat(&local_178);
    local_258 = deRandom_getFloat(&local_178);
    fVar25 = deRandom_getFloat(&local_178);
    piVar22 = (int *)((long)&local_168 + lVar23 * 0xc);
    uVar30 = *(undefined8 *)piVar22;
    fVar26 = (float)(int)uVar30;
    fVar27 = (float)(int)((ulong)uVar30 >> 0x20);
    local_3c8.p0.m_data[0] = fVar26;
    local_3c8.p0.m_data[1] = fVar27;
    local_3c8.p0.m_data[2] = (float)(&iStack_160)[lVar23 * 3];
    local_458 = (long *)0x0;
    local_450 = local_450 & 0xffffffff00000000;
    lVar12 = 0;
    do {
      *(float *)((long)&local_458 + lVar12 * 4) = local_3c8.p0.m_data[lVar12] * 30000.0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_368.c2.m_data[0] = local_368.c2.m_data[0] * 15.8 + 0.2;
    local_258 = local_258 * 15.8 + 0.2;
    fVar25 = fVar25 * 15.8 + 0.2;
    fStack_260 = local_368.c2.m_data[0] * 0.0;
    fStack_25c = local_368.c2.m_data[0] * 0.0;
    local_268._4_4_ = local_368.c2.m_data[0] * 0.3;
    local_268._0_4_ = local_368.c2.m_data[0] * 0.2;
    local_218 = CONCAT44(local_258 * -0.4,local_258 * -0.3);
    uStack_210 = CONCAT44(local_258 * 0.0,local_258 * 0.0);
    local_288 = local_458;
    afStack_280[0] = 0.0;
    afStack_280[1] = 0.0;
    local_208 = (undefined8 *)CONCAT44(extraout_var._0_4_,fVar25);
    uStack_200 = extraout_var._4_8_;
    local_278._0_4_ = (float)local_450 * fVar25;
    local_478 = &local_468;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"clip","");
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
    local_498 = &local_488;
    plVar18 = plVar13 + 2;
    if ((long *)*plVar13 == plVar18) {
      lStack_480 = plVar13[3];
      local_488 = *plVar18;
    }
    else {
      local_498 = (long *)*plVar13;
      local_488 = *plVar18;
    }
    uStack_490 = plVar13[1];
    *plVar13 = (long)plVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_498);
    local_3c8.p0.m_data._0_8_ = &local_3c8.c0;
    plVar18 = plVar13 + 2;
    if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
      local_3c8.c0.m_data._0_8_ = *plVar18;
      local_3c8.c0.m_data._8_8_ = plVar13[3];
    }
    else {
      local_3c8.p0.m_data._0_8_ = (Vec4 *)*plVar13;
      local_3c8.c0.m_data._0_8_ = *plVar18;
    }
    local_3c8.p0.m_data._8_8_ = plVar13[1];
    *plVar13 = (long)plVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_3c8);
    local_2e8.p0.m_data._0_8_ = &local_2e8.c0;
    plVar18 = plVar13 + 2;
    if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
      local_2e8.c0.m_data._0_8_ = *plVar18;
      local_2e8.c0.m_data._8_8_ = plVar13[3];
    }
    else {
      local_2e8.p0.m_data._0_8_ = (Vec4 *)*plVar13;
      local_2e8.c0.m_data._0_8_ = *plVar18;
    }
    local_2e8.p0.m_data._8_8_ = plVar13[1];
    *plVar13 = (long)plVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((Vec4 *)local_3c8.p0.m_data._0_8_ != &local_3c8.c0) {
      operator_delete((void *)local_3c8.p0.m_data._0_8_,local_3c8.c0.m_data._0_8_ + 1);
    }
    if (local_498 != &local_488) {
      operator_delete(local_498,local_488 + 1);
    }
    if (local_478 != &local_468) {
      operator_delete(local_478,local_468 + 1);
    }
    local_3c8.p0.m_data[0] = (float)local_268;
    local_3c8.p0.m_data[1] = local_268._4_4_;
    local_3c8.p0.m_data[3] = local_368.c2.m_data[0];
    local_3c8.p0.m_data[2] = local_368.c2.m_data[0] * 0.0;
    local_3c8.c0.m_data[0] = 1.0;
    local_3c8.c0.m_data[1] = 1.0;
    local_3c8.c0.m_data[2] = 1.0;
    local_3c8.c0.m_data[3] = 1.0;
    local_3c8.p1.m_data[0] = (float)(int)local_218;
    local_3c8.p1.m_data[1] = (float)local_218._4_4_;
    local_3c8.p1.m_data[3] = local_258;
    local_3c8.p1.m_data[2] = local_258 * 0.0;
    local_3c8.c1.m_data[0] = 1.0;
    local_3c8.c1.m_data[1] = 1.0;
    local_3c8.c1.m_data[2] = 1.0;
    local_3c8.c1.m_data[3] = 1.0;
    local_3c8.p2.m_data[1] = (float)local_208 * local_288._4_4_;
    local_3c8.p2.m_data[0] = (float)local_208 * (float)local_288;
    local_3c8.p2.m_data[3] = (float)local_208;
    local_3c8.p2.m_data[2] = (float)local_278;
    local_3c8.c2.m_data[0] = 1.0;
    local_3c8.c2.m_data[1] = 1.0;
    local_3c8.c2.m_data[2] = 1.0;
    local_3c8.c2.m_data[3] = 1.0;
    if ((*piVar22 != 0) || (*(int *)((long)&local_168 + lVar23 * 0xc + 4) != 0)) {
      pTVar14 = (TriangleCaseBase *)operator_new(0xa0);
      TriangleCaseBase::TriangleCaseBase
                (pTVar14,(local_2f8->super_TestCaseGroup).m_context,
                 (char *)local_2e8.p0.m_data._0_8_,"clip one vertex",&local_3c8,&local_368,
                 (WindowRectangle *)(anonymous_namespace)::VIEWPORT_CENTER);
      (pTVar14->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TriangleCaseBase_00d0cf60;
      tcu::TestNode::addChild(node,(TestNode *)pTVar14);
    }
    if ((Vec4 *)local_2e8.p0.m_data._0_8_ != &local_2e8.c0) {
      operator_delete((void *)local_2e8.p0.m_data._0_8_,local_2e8.c0.m_data._0_8_ + 1);
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x1a);
  local_3c8.p0.m_data[0] = 0.0;
  local_3c8.p0.m_data[1] = -0.7;
  local_3c8.p0.m_data[2] = -0.9;
  local_3c8.p0.m_data[3] = 1.0;
  local_3c8.c0.m_data[0] = 1.0;
  local_3c8.c0.m_data[1] = 1.0;
  local_3c8.c0.m_data[2] = 1.0;
  local_3c8.c0.m_data[3] = 1.0;
  local_3c8.p1.m_data[0] = 0.8;
  local_3c8.p1.m_data[1] = 0.0;
  local_3c8.p1.m_data[2] = -0.7;
  local_3c8.p1.m_data[3] = 1.0;
  local_3c8.c1.m_data[0] = 1.0;
  local_3c8.c1.m_data[1] = 1.0;
  local_3c8.c1.m_data[2] = 1.0;
  local_3c8.c1.m_data[3] = 1.0;
  local_3c8.p2.m_data[0] = -0.9;
  local_3c8.p2.m_data[1] = 0.9;
  local_3c8.p2.m_data[2] = 3.0;
  local_3c8.p2.m_data[3] = 1.0;
  local_3c8.c2.m_data[0] = 1.0;
  local_3c8.c2.m_data[1] = 1.0;
  local_3c8.c2.m_data[2] = 1.0;
  local_3c8.c2.m_data[3] = 1.0;
  local_2e8.p0.m_data._0_8_ = (Vec4 *)0xbf33333300000000;
  local_2e8.p0.m_data[2] = 0.9;
  local_2e8.p0.m_data[3] = 1.0;
  local_2e8.c0.m_data[0] = 1.0;
  local_2e8.c0.m_data[1] = 1.0;
  local_2e8.c0.m_data[2] = 1.0;
  local_2e8.c0.m_data[3] = 1.0;
  local_2e8.p1.m_data[0] = 0.4;
  local_2e8.p1.m_data[1] = 0.0;
  local_2e8.p1.m_data[2] = 0.7;
  local_2e8.p1.m_data[3] = 1.0;
  local_2e8.c1.m_data[0] = 1.0;
  local_2e8.c1.m_data[1] = 1.0;
  local_2e8.c1.m_data[2] = 1.0;
  local_2e8.c1.m_data[3] = 1.0;
  local_2e8.p2.m_data[0] = -0.9;
  local_2e8.p2.m_data[1] = 0.9;
  local_2e8.p2.m_data[2] = -3.0;
  local_2e8.p2.m_data[3] = 1.0;
  local_2e8.c2.m_data[0] = 1.0;
  local_2e8.c2.m_data[1] = 1.0;
  local_2e8.c2.m_data[2] = 1.0;
  local_2e8.c2.m_data[3] = 1.0;
  pTVar14 = (TriangleCaseBase *)operator_new(0xa0);
  pPVar10 = local_2f8;
  TriangleCaseBase::TriangleCaseBase
            (pTVar14,(local_2f8->super_TestCaseGroup).m_context,"clip_pos_z","clip one vertex",
             &local_3c8,&local_368,(WindowRectangle *)(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar14->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_00d0cf60;
  tcu::TestNode::addChild(node,(TestNode *)pTVar14);
  pTVar14 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar14,(pPVar10->super_TestCaseGroup).m_context,"clip_neg_z","clip one vertex",
             &local_2e8,(TriangleData *)&local_288,
             (WindowRectangle *)(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar14->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_00d0cf60;
  tcu::TestNode::addChild(node,(TestNode *)pTVar14);
  local_368.p1.m_data[0] = 1.4013e-45;
  local_368.p1.m_data[1] = 0.0;
  local_288 = (long *)0x19;
  local_300 = (undefined1 *)0x0;
  do {
    if (local_300 < 0x19) {
      local_368.p1.m_data._8_8_ = (long)local_300 * 0xc;
      local_2f0 = auStack_15c + local_368.p1.m_data._8_8_;
      lVar23 = 0;
      do {
        local_368.c2.m_data[0] = deRandom_getFloat(&local_178);
        local_268._0_4_ = deRandom_getFloat(&local_178);
        local_268._4_4_ = extraout_XMM0_Db;
        fStack_260 = extraout_XMM0_Dc;
        fStack_25c = extraout_XMM0_Dd;
        local_258 = deRandom_getFloat(&local_178);
        iVar15 = *(int *)((long)&iStack_160 + local_368.p1.m_data._8_8_);
        iVar16 = *(int *)(local_2f0 + lVar23 * 0xc + 8);
        local_368.c2.m_data[0] = local_368.c2.m_data[0] * 15.8 + 0.2;
        fStack_270 = local_368.c2.m_data[0] * 0.0;
        fStack_26c = local_368.c2.m_data[0] * 0.0;
        local_278._4_4_ = local_368.c2.m_data[0] * 0.3;
        local_278._0_4_ = local_368.c2.m_data[0] * 0.2;
        local_218 = *(long *)((long)&local_168 + local_368.p1.m_data._8_8_);
        uStack_210 = 0;
        local_208 = *(undefined8 **)(local_2f0 + lVar23 * 0xc);
        uStack_200 = 0;
        local_418._0_8_ = &local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"clip","");
        plVar13 = (long *)std::__cxx11::string::append((char *)local_418);
        local_438._0_8_ = &local_428;
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          local_428 = *plVar18;
          lStack_420 = plVar13[3];
        }
        else {
          local_428 = *plVar18;
          local_438._0_8_ = (long *)*plVar13;
        }
        local_438._8_8_ = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append(local_438);
        local_3f8 = &local_3e8;
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          lStack_3e0 = plVar13[3];
          local_3e8 = *plVar18;
        }
        else {
          local_3f8 = (long *)*plVar13;
          local_3e8 = *plVar18;
        }
        local_3f0 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_3f8);
        local_458 = &local_448;
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          local_448 = *plVar18;
          lStack_440 = plVar13[3];
        }
        else {
          local_448 = *plVar18;
          local_458 = (long *)*plVar13;
        }
        local_450 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_458);
        local_478 = &local_468;
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          lStack_460 = plVar13[3];
          local_468 = *plVar18;
        }
        else {
          local_478 = (long *)*plVar13;
          local_468 = *plVar18;
        }
        uStack_470 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
        local_498 = &local_488;
        plVar18 = plVar13 + 2;
        if ((long *)*plVar13 == plVar18) {
          lStack_480 = plVar13[3];
          local_488 = *plVar18;
        }
        else {
          local_498 = (long *)*plVar13;
          local_488 = *plVar18;
        }
        uStack_490 = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_498);
        local_3c8.p0.m_data._0_8_ = &local_3c8.c0;
        plVar18 = plVar13 + 2;
        if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
          local_3c8.c0.m_data._0_8_ = *plVar18;
          local_3c8.c0.m_data._8_8_ = plVar13[3];
        }
        else {
          local_3c8.p0.m_data._0_8_ = (Vec4 *)*plVar13;
          local_3c8.c0.m_data._0_8_ = *plVar18;
        }
        local_3c8.p0.m_data._8_8_ = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_2e8.p0.m_data._0_8_ = &local_2e8.c0;
        plVar18 = plVar13 + 2;
        if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
          local_2e8.c0.m_data._0_8_ = *plVar18;
          local_2e8.c0.m_data._8_8_ = plVar13[3];
        }
        else {
          local_2e8.p0.m_data._0_8_ = (Vec4 *)*plVar13;
          local_2e8.c0.m_data._0_8_ = *plVar18;
        }
        local_2e8.p0.m_data._8_8_ = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if ((Vec4 *)local_3c8.p0.m_data._0_8_ != &local_3c8.c0) {
          operator_delete((void *)local_3c8.p0.m_data._0_8_,local_3c8.c0.m_data._0_8_ + 1);
        }
        if (local_498 != &local_488) {
          operator_delete(local_498,local_488 + 1);
        }
        if (local_478 != &local_468) {
          operator_delete(local_478,local_468 + 1);
        }
        if (local_458 != &local_448) {
          operator_delete(local_458,local_448 + 1);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8,local_3e8 + 1);
        }
        if ((long *)local_438._0_8_ != &local_428) {
          operator_delete((void *)local_438._0_8_,local_428 + 1);
        }
        if ((long *)local_418._0_8_ != &local_408) {
          operator_delete((void *)local_418._0_8_,local_408 + 1);
        }
        local_3c8.p1.m_data[3] = (float)local_268 * 15.8 + 0.2;
        local_3c8.p2.m_data[3] = local_258 * 15.8 + 0.2;
        local_3c8.p1.m_data[0] = local_3c8.p1.m_data[3] * (float)(int)local_218 * 30000.0;
        local_3c8.p1.m_data[1] = local_3c8.p1.m_data[3] * (float)local_218._4_4_ * 30000.0;
        local_3c8.p0.m_data[0] = (float)local_278;
        local_3c8.p0.m_data[1] = local_278._4_4_;
        local_3c8.p0.m_data[3] = local_368.c2.m_data[0];
        local_3c8.p0.m_data[2] = local_368.c2.m_data[0] * 0.0;
        local_3c8.c0.m_data[0] = 1.0;
        local_3c8.c0.m_data[1] = 1.0;
        local_3c8.c0.m_data[2] = 1.0;
        local_3c8.c0.m_data[3] = 1.0;
        local_3c8.p1.m_data[2] = (float)iVar15 * 30000.0 * local_3c8.p1.m_data[3];
        local_3c8.c1.m_data[0] = 1.0;
        local_3c8.c1.m_data[1] = 1.0;
        local_3c8.c1.m_data[2] = 1.0;
        local_3c8.c1.m_data[3] = 1.0;
        local_3c8.p2.m_data[1] = local_3c8.p2.m_data[3] * (float)local_208._4_4_ * 30000.0;
        local_3c8.p2.m_data[0] = local_3c8.p2.m_data[3] * (float)(int)(float)local_208 * 30000.0;
        local_3c8.p2.m_data[2] = (float)iVar16 * 30000.0 * local_3c8.p2.m_data[3];
        local_498 = (long *)CONCAT44(-(uint)((int)local_218 < 0),(int)local_218);
        uStack_490 = CONCAT44(-(uint)((long)local_218 < 0),local_218._4_4_);
        local_478 = (long *)CONCAT44(-(uint)((int)(float)local_208 < 0),(float)local_208);
        uStack_470 = CONCAT44(-(uint)((long)local_208 < 0),local_208._4_4_);
        local_3c8.c2.m_data[0] = 1.0;
        local_3c8.c2.m_data[1] = 1.0;
        local_3c8.c2.m_data[2] = 1.0;
        local_3c8.c2.m_data[3] = 1.0;
        local_488 = (long)iVar15;
        local_468 = (long)iVar16;
        local_458 = (long *)0xc;
        local_450 = 0x13;
        local_448 = 0;
        local_408 = 0;
        local_418 = (undefined1  [16])0x0;
        lVar12 = 0;
        do {
          *(undefined8 *)(local_418 + lVar12 * 8) = (&local_498)[lVar12] << 10;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_438 = (undefined1  [16])0x0;
        local_428 = 0;
        lVar12 = 0;
        do {
          *(long *)(local_438 + lVar12 * 8) =
               *(long *)(local_418 + lVar12 * 8) - (&local_458)[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_248.m_data[0] = 0.0;
        local_248.m_data[1] = 0.0;
        local_248.m_data[2] = 0.0;
        local_248.m_data[3] = 0.0;
        local_238 = 0;
        lVar12 = 0;
        do {
          *(undefined8 *)(local_248.m_data + lVar12 * 2) = (&local_478)[lVar12] << 10;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_368.p0.m_data[0] = 0.0;
        local_368.p0.m_data[1] = 0.0;
        local_368.p0.m_data[2] = 0.0;
        local_368.p0.m_data[3] = 0.0;
        local_368.c0.m_data[0] = 0.0;
        local_368.c0.m_data[1] = 0.0;
        lVar12 = 0;
        do {
          *(long *)(local_368.p0.m_data + lVar12 * 2) =
               *(long *)(local_248.m_data + lVar12 * 2) - (&local_458)[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_3e8 = local_438._0_8_ * local_368.p0.m_data._8_8_ -
                    local_368.p0.m_data._0_8_ * local_438._8_8_;
        local_3f8 = (long *)(local_368.c0.m_data._0_8_ * local_438._8_8_ -
                            local_428 * local_368.p0.m_data._8_8_);
        local_3f0 = local_428 * local_368.p0.m_data._0_8_ -
                    local_368.c0.m_data._0_8_ * local_438._0_8_;
        lVar12 = 0;
        lVar19 = 0;
        do {
          lVar19 = lVar19 + (&local_3f8)[lVar12] * (&local_3f8)[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar19 = SUB168(SEXT816(lVar19) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar19;
        if (-1 < ((lVar19 >> 6) - (lVar19 >> 0x3f)) + local_3e8 * local_3e8) {
          pTVar14 = (TriangleCaseBase *)operator_new(0xa0);
          TriangleCaseBase::TriangleCaseBase
                    (pTVar14,(local_2f8->super_TestCaseGroup).m_context,
                     (char *)local_2e8.p0.m_data._0_8_,"clip two vertices",&local_3c8,&local_368,
                     (WindowRectangle *)(anonymous_namespace)::VIEWPORT_CENTER);
          (pTVar14->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode = (_func_int **)&PTR__TriangleCaseBase_00d0cf60;
          tcu::TestNode::addChild(local_220,(TestNode *)pTVar14);
        }
        if ((Vec4 *)local_2e8.p0.m_data._0_8_ != &local_2e8.c0) {
          operator_delete((void *)local_2e8.p0.m_data._0_8_,local_2e8.c0.m_data._0_8_ + 1);
        }
        lVar23 = lVar23 + 1;
      } while ((long *)lVar23 != local_288);
    }
    local_300 = (undefined1 *)((long)local_300 + 1);
    local_368.p1.m_data._0_8_ = local_368.p1.m_data._0_8_ + 1;
    local_288 = (long *)((long)local_288 + -1);
  } while (local_300 != (undefined1 *)0x1a);
  local_1e8 = 2;
  local_1f0 = 1;
  local_2f0 = (undefined1 *)0x19;
  local_368.p1.m_data._0_8_ = 0;
  do {
    if ((ulong)local_368.p1.m_data._0_8_ < 0x19) {
      lVar23 = local_368.p1.m_data._0_8_ * 0xc;
      local_208 = (undefined8 *)((long)&local_168 + lVar23);
      local_368.p1.m_data._8_8_ = (long)&local_168 + local_368.p1.m_data._0_8_ * 0xc;
      local_300 = auStack_15c + lVar23;
      local_220 = (TestNode *)((long)&uStack_150 + lVar23);
      local_288 = (long *)local_1e8;
      local_268 = 0;
      local_218 = local_1f0;
      do {
        if (local_218 < 0x19) {
          pfVar1 = (float *)(local_300 + local_268 * 0xc);
          local_278 = (long)&local_168 + local_218 * 0xc;
          lVar12 = local_268 * 0xc + (long)local_220;
          lVar23 = 0;
          uVar21 = (ulong)local_288;
          do {
            local_368.c2.m_data[0] = deRandom_getFloat(&local_178);
            local_258 = deRandom_getFloat(&local_178);
            fVar25 = deRandom_getFloat(&local_178);
            local_3d0 = *(int *)(local_208 + 1);
            local_3d8 = *local_208;
            local_368.p2.m_data[2] = pfVar1[2];
            uVar30 = *(undefined8 *)pfVar1;
            local_368.p2.m_data[0] = (float)uVar30;
            local_368.p2.m_data[1] = SUB84(uVar30,4);
            local_368.c1.m_data[2] = *(float *)(lVar12 + 8 + lVar23 * 0xc);
            uVar3 = *(undefined8 *)(lVar12 + lVar23 * 0xc);
            local_368.c1.m_data[0] = (float)uVar3;
            local_368.c1.m_data[1] = SUB84(uVar3,4);
            iVar15 = (int)local_3d8;
            iVar16 = (int)((ulong)local_3d8 >> 0x20);
            if (((int)(float)uVar30 - iVar15) * ((int)SUB84(uVar3,4) - iVar16) !=
                ((int)SUB84(uVar30,4) - iVar16) * ((int)(float)uVar3 - iVar15)) {
              fVar32 = local_258 * 15.8 + 0.2;
              fVar31 = local_368.c2.m_data[0] * 15.8 + 0.2;
              fVar25 = fVar25 * 15.8 + 0.2;
              uVar28._0_4_ = fVar31 * (float)iVar15 * 30000.0;
              uVar28._4_4_ = fVar31 * (float)iVar16 * 30000.0;
              uVar29._0_4_ = fVar32 * (float)(int)(float)uVar30 * 30000.0;
              uVar29._4_4_ = fVar32 * (float)(int)SUB84(uVar30,4) * 30000.0;
              uVar30._0_4_ = fVar25 * (float)(int)(float)uVar3 * 30000.0;
              uVar30._4_4_ = fVar25 * (float)(int)SUB84(uVar3,4) * 30000.0;
              local_368.p0.m_data._0_12_ = ZEXT812(0);
              local_2e8.p0.m_data._8_8_ = local_2e8.p0.m_data._8_8_ & 0xffffffff00000000;
              local_2e8.p0.m_data[0] = 0.0;
              local_2e8.p0.m_data[1] = 0.0;
              lVar19 = 0;
              do {
                local_2e8.p0.m_data[lVar19] =
                     (float)((int)local_368.p2.m_data[lVar19] -
                            *(int *)((long)&local_3d8 + lVar19 * 4));
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              uStack_490 = uStack_490 & 0xffffffff00000000;
              local_498 = (long *)0x0;
              lVar19 = 0;
              do {
                *(int *)((long)&local_498 + lVar19 * 4) =
                     (int)local_368.c1.m_data[lVar19] - *(int *)((long)&local_3d8 + lVar19 * 4);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_3c8.p0.m_data[1] =
                   (float)((int)local_2e8.p0.m_data[2] * (int)local_498 -
                          (int)uStack_490 * (int)local_2e8.p0.m_data[0]);
              local_3c8.p0.m_data[0] =
                   (float)((int)uStack_490 * (int)local_2e8.p0.m_data[1] -
                          (int)local_2e8.p0.m_data[2] * local_498._4_4_);
              local_3c8.p0.m_data[2] =
                   (float)((int)local_2e8.p0.m_data[0] * local_498._4_4_ -
                          (int)local_498 * (int)local_2e8.p0.m_data[1]);
              local_2e8.p0.m_data._8_8_ = local_2e8.p0.m_data._8_8_ & 0xffffffff00000000;
              local_2e8.p0.m_data._0_8_ = (Vec4 *)0x0;
              lVar19 = 0;
              do {
                local_2e8.p0.m_data[lVar19] =
                     (float)((int)local_368.p0.m_data[lVar19] -
                            *(int *)((long)&local_3d8 + lVar19 * 4));
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              lVar19 = 0;
              iVar15 = 0;
              do {
                iVar15 = iVar15 + (int)local_2e8.p0.m_data[lVar19] *
                                  (int)local_3c8.p0.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              if (iVar15 == 0) {
                uStack_470 = uStack_470 & 0xffffffff00000000;
                local_478 = (long *)0x0;
                lVar19 = 0;
                do {
                  *(int *)((long)&local_478 + lVar19 * 4) =
                       (int)local_368.p2.m_data[lVar19] - *(int *)((long)&local_3d8 + lVar19 * 4);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_450 = local_450 & 0xffffffff00000000;
                local_458 = (long *)0x0;
                lVar19 = 0;
                do {
                  *(int *)((long)&local_458 + lVar19 * 4) =
                       (int)local_368.p0.m_data[lVar19] - *(int *)((long)&local_3d8 + lVar19 * 4);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_498 = (long *)CONCAT44((int)uStack_470 * (int)local_458 -
                                             (int)(float)local_450 * (int)local_478,
                                             (int)(float)local_450 * local_478._4_4_ -
                                             (int)uStack_470 * local_458._4_4_);
                uStack_490 = CONCAT44(uStack_490._4_4_,
                                      (int)local_478 * local_458._4_4_ -
                                      (int)local_458 * local_478._4_4_);
                lVar19 = 0;
                iVar15 = 0;
                do {
                  iVar15 = iVar15 + *(int *)((long)&local_498 + lVar19 * 4) *
                                    (int)local_3c8.p0.m_data[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_438._8_4_ = 0;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_438._8_8_;
                local_438 = auVar4 << 0x40;
                lVar19 = 0;
                do {
                  *(int *)(local_438 + lVar19 * 4) =
                       (int)local_368.c1.m_data[lVar19] - *(int *)((long)&local_3d8 + lVar19 * 4);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_418._8_4_ = 0;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_418._8_8_;
                local_418 = auVar5 << 0x40;
                lVar19 = 0;
                do {
                  *(int *)(local_418 + lVar19 * 4) =
                       (int)local_368.p0.m_data[lVar19] - *(int *)((long)&local_3d8 + lVar19 * 4);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_3f8 = (long *)CONCAT44(local_438._8_4_ * local_418._0_4_ -
                                             local_418._8_4_ * local_438._0_4_,
                                             local_418._8_4_ * local_438._4_4_ -
                                             local_438._8_4_ * local_418._4_4_);
                local_3f0 = CONCAT44(local_3f0._4_4_,
                                     local_438._0_4_ * local_418._4_4_ -
                                     local_418._0_4_ * local_438._4_4_);
                lVar19 = 0;
                iVar16 = 0;
                do {
                  iVar16 = iVar16 + *(int *)((long)&local_3f8 + lVar19 * 4) *
                                    (int)local_3c8.p0.m_data[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                iVar20 = iVar15 >> 0x1f;
                if (0 < iVar15) {
                  iVar20 = 1;
                }
                iVar15 = iVar16 >> 0x1f;
                if (0 < iVar16) {
                  iVar15 = 1;
                }
                if (iVar20 != iVar15) {
                  uStack_470 = uStack_470 & 0xffffffff00000000;
                  local_478 = (long *)0x0;
                  lVar19 = 0;
                  do {
                    *(int *)((long)&local_478 + lVar19 * 4) =
                         (int)local_368.c1.m_data[lVar19] - (int)local_368.p2.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_450 = local_450 & 0xffffffff00000000;
                  local_458 = (long *)0x0;
                  lVar19 = 0;
                  do {
                    *(int *)((long)&local_458 + lVar19 * 4) =
                         (int)local_368.p0.m_data[lVar19] - (int)local_368.p2.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_498 = (long *)CONCAT44((int)uStack_470 * (int)local_458 -
                                               (int)(float)local_450 * (int)local_478,
                                               (int)(float)local_450 * local_478._4_4_ -
                                               (int)uStack_470 * local_458._4_4_);
                  uStack_490 = CONCAT44(uStack_490._4_4_,
                                        (int)local_478 * local_458._4_4_ -
                                        (int)local_458 * local_478._4_4_);
                  lVar19 = 0;
                  iVar15 = 0;
                  do {
                    iVar15 = iVar15 + *(int *)((long)&local_498 + lVar19 * 4) *
                                      (int)local_3c8.p0.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_438._8_4_ = 0;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_438._8_8_;
                  local_438 = auVar6 << 0x40;
                  lVar19 = 0;
                  do {
                    *(int *)(local_438 + lVar19 * 4) =
                         *(int *)((long)&local_3d8 + lVar19 * 4) - (int)local_368.p2.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_418._8_4_ = 0;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_418._8_8_;
                  local_418 = auVar7 << 0x40;
                  lVar19 = 0;
                  do {
                    *(int *)(local_418 + lVar19 * 4) =
                         (int)local_368.p0.m_data[lVar19] - (int)local_368.p2.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_3f8 = (long *)CONCAT44(local_438._8_4_ * local_418._0_4_ -
                                               local_418._8_4_ * local_438._0_4_,
                                               local_418._8_4_ * local_438._4_4_ -
                                               local_438._8_4_ * local_418._4_4_);
                  local_3f0 = CONCAT44(local_3f0._4_4_,
                                       local_438._0_4_ * local_418._4_4_ -
                                       local_418._0_4_ * local_438._4_4_);
                  lVar19 = 0;
                  iVar16 = 0;
                  do {
                    iVar16 = iVar16 + *(int *)((long)&local_3f8 + lVar19 * 4) *
                                      (int)local_3c8.p0.m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  iVar20 = iVar15 >> 0x1f;
                  if (0 < iVar15) {
                    iVar20 = 1;
                  }
                  iVar15 = iVar16 >> 0x1f;
                  if (0 < iVar16) {
                    iVar15 = 1;
                  }
                  if (iVar20 != iVar15) {
                    uStack_470 = uStack_470 & 0xffffffff00000000;
                    local_478 = (long *)0x0;
                    lVar19 = 0;
                    do {
                      *(int *)((long)&local_478 + lVar19 * 4) =
                           *(int *)((long)&local_3d8 + lVar19 * 4) -
                           (int)local_368.c1.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_450 = local_450 & 0xffffffff00000000;
                    local_458 = (long *)0x0;
                    lVar19 = 0;
                    do {
                      *(int *)((long)&local_458 + lVar19 * 4) =
                           (int)local_368.p0.m_data[lVar19] - (int)local_368.c1.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_498 = (long *)CONCAT44((int)uStack_470 * (int)local_458 -
                                                 (int)(float)local_450 * (int)local_478,
                                                 (int)(float)local_450 * local_478._4_4_ -
                                                 (int)uStack_470 * local_458._4_4_);
                    uStack_490 = CONCAT44(uStack_490._4_4_,
                                          (int)local_478 * local_458._4_4_ -
                                          (int)local_458 * local_478._4_4_);
                    lVar19 = 0;
                    uVar11 = 0;
                    do {
                      uVar11 = uVar11 + *(int *)((long)&local_498 + lVar19 * 4) *
                                        (int)local_3c8.p0.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_438._8_4_ = 0;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_438._8_8_;
                    local_438 = auVar8 << 0x40;
                    lVar19 = 0;
                    do {
                      *(int *)(local_438 + lVar19 * 4) =
                           (int)local_368.p2.m_data[lVar19] - (int)local_368.c1.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_418._8_4_ = 0;
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = local_418._8_8_;
                    local_418 = auVar9 << 0x40;
                    lVar19 = 0;
                    do {
                      *(int *)(local_418 + lVar19 * 4) =
                           (int)local_368.p0.m_data[lVar19] - (int)local_368.c1.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_3f8 = (long *)CONCAT44(local_438._8_4_ * local_418._0_4_ -
                                                 local_418._8_4_ * local_438._0_4_,
                                                 local_418._8_4_ * local_438._4_4_ -
                                                 local_438._8_4_ * local_418._4_4_);
                    local_3f0 = CONCAT44(local_3f0._4_4_,
                                         local_438._0_4_ * local_418._4_4_ -
                                         local_418._0_4_ * local_438._4_4_);
                    lVar19 = 0;
                    uVar17 = 0;
                    do {
                      uVar17 = uVar17 + *(int *)((long)&local_3f8 + lVar19 * 4) *
                                        (int)local_3c8.p0.m_data[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    bVar24 = (int)uVar17 < 1;
                    if ((int)uVar11 < 1) {
                      bVar24 = (int)(uVar17 ^ uVar11) < 0 || 0 < (int)uVar17;
                    }
                    if (bVar24) {
                      local_3c8.p0.m_data[3] = fVar31;
                      local_3c8.p0.m_data[2] = (float)local_3d0 * 30000.0 * fVar31;
                      local_3c8.c0.m_data[0] = 1.0;
                      local_3c8.c0.m_data[1] = 1.0;
                      local_3c8.c0.m_data[2] = 1.0;
                      local_3c8.c0.m_data[3] = 1.0;
                      local_3c8.p1.m_data[3] = fVar32;
                      local_3c8.p1.m_data[2] = (float)(int)local_368.p2.m_data[2] * 30000.0 * fVar32
                      ;
                      local_3c8.c1.m_data[0] = 1.0;
                      local_3c8.c1.m_data[1] = 1.0;
                      local_3c8.c1.m_data[2] = 1.0;
                      local_3c8.c1.m_data[3] = 1.0;
                      local_3c8.p2.m_data[3] = fVar25;
                      local_3c8.p2.m_data[2] = (float)(int)local_368.c1.m_data[2] * 30000.0 * fVar25
                      ;
                      local_3c8.c2.m_data[0] = 1.0;
                      local_3c8.c2.m_data[1] = 1.0;
                      local_3c8.c2.m_data[2] = 1.0;
                      local_3c8.c2.m_data[3] = 1.0;
                      local_1a0[0] = local_190;
                      local_3c8.p0.m_data._0_8_ = uVar28;
                      local_3c8.p1.m_data._0_8_ = uVar29;
                      local_3c8.p2.m_data._0_8_ = uVar30;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"clip","")
                      ;
                      plVar13 = (long *)std::__cxx11::string::append((char *)local_1a0);
                      local_1e0 = &local_1d0;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_1d0 = *plVar18;
                        lStack_1c8 = plVar13[3];
                      }
                      else {
                        local_1d0 = *plVar18;
                        local_1e0 = (long *)*plVar13;
                      }
                      local_1d8 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                      local_1c0 = &local_1b0;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_1b0 = *plVar18;
                        lStack_1a8 = plVar13[3];
                      }
                      else {
                        local_1b0 = *plVar18;
                        local_1c0 = (long *)*plVar13;
                      }
                      local_1b8 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c0);
                      local_248.m_data._0_8_ = &local_238;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_238 = *plVar18;
                        lStack_230 = plVar13[3];
                      }
                      else {
                        local_238 = *plVar18;
                        local_248.m_data._0_8_ = (long *)*plVar13;
                      }
                      local_248.m_data._8_8_ = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
                      local_368.p0.m_data._0_8_ = &local_368.c0;
                      plVar18 = plVar13 + 2;
                      if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
                        local_368.c0.m_data._0_8_ = *plVar18;
                        local_368.c0.m_data._8_8_ = plVar13[3];
                      }
                      else {
                        local_368.c0.m_data._0_8_ = *plVar18;
                        local_368.p0.m_data._0_8_ = (Vec4 *)*plVar13;
                      }
                      local_368.p0.m_data._8_8_ = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_368);
                      local_418._0_8_ = &local_408;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_408 = *plVar18;
                        lStack_400 = plVar13[3];
                      }
                      else {
                        local_408 = *plVar18;
                        local_418._0_8_ = (long *)*plVar13;
                      }
                      local_418._8_8_ = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append(local_418);
                      local_438._0_8_ = &local_428;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_428 = *plVar18;
                        lStack_420 = plVar13[3];
                      }
                      else {
                        local_428 = *plVar18;
                        local_438._0_8_ = (long *)*plVar13;
                      }
                      local_438._8_8_ = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append(local_438);
                      local_3f8 = &local_3e8;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        local_3e8 = *plVar18;
                        lStack_3e0 = plVar13[3];
                      }
                      else {
                        local_3e8 = *plVar18;
                        local_3f8 = (long *)*plVar13;
                      }
                      local_3f0 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_3f8);
                      local_458 = &local_448;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        lStack_440 = plVar13[3];
                        local_448 = *plVar18;
                      }
                      else {
                        local_458 = (long *)*plVar13;
                        local_448 = *plVar18;
                      }
                      local_450 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_458);
                      local_478 = &local_468;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        lStack_460 = plVar13[3];
                        local_468 = *plVar18;
                      }
                      else {
                        local_478 = (long *)*plVar13;
                        local_468 = *plVar18;
                      }
                      uStack_470 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_478);
                      local_498 = &local_488;
                      plVar18 = plVar13 + 2;
                      if ((long *)*plVar13 == plVar18) {
                        lStack_480 = plVar13[3];
                        local_488 = *plVar18;
                      }
                      else {
                        local_498 = (long *)*plVar13;
                        local_488 = *plVar18;
                      }
                      uStack_490 = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_498);
                      local_2e8.p0.m_data._0_8_ = &local_2e8.c0;
                      plVar18 = plVar13 + 2;
                      if ((Vec4 *)*plVar13 == (Vec4 *)plVar18) {
                        local_2e8.c0.m_data._0_8_ = *plVar18;
                        local_2e8.c0.m_data._8_8_ = plVar13[3];
                      }
                      else {
                        local_2e8.c0.m_data._0_8_ = *plVar18;
                        local_2e8.p0.m_data._0_8_ = (Vec4 *)*plVar13;
                      }
                      local_2e8.p0.m_data._8_8_ = plVar13[1];
                      *plVar13 = (long)plVar18;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      if (local_498 != &local_488) {
                        operator_delete(local_498,local_488 + 1);
                      }
                      if (local_478 != &local_468) {
                        operator_delete(local_478,local_468 + 1);
                      }
                      if (local_458 != &local_448) {
                        operator_delete(local_458,local_448 + 1);
                      }
                      if (local_3f8 != &local_3e8) {
                        operator_delete(local_3f8,local_3e8 + 1);
                      }
                      if ((long *)local_438._0_8_ != &local_428) {
                        operator_delete((void *)local_438._0_8_,local_428 + 1);
                      }
                      if ((long *)local_418._0_8_ != &local_408) {
                        operator_delete((void *)local_418._0_8_,local_408 + 1);
                      }
                      if ((Vec4 *)local_368.p0.m_data._0_8_ != &local_368.c0) {
                        operator_delete((void *)local_368.p0.m_data._0_8_,
                                        local_368.c0.m_data._0_8_ + 1);
                      }
                      if ((long *)local_248.m_data._0_8_ != &local_238) {
                        operator_delete((void *)local_248.m_data._0_8_,local_238 + 1);
                      }
                      if (local_1c0 != &local_1b0) {
                        operator_delete(local_1c0,local_1b0 + 1);
                      }
                      if (local_1e0 != &local_1d0) {
                        operator_delete(local_1e0,local_1d0 + 1);
                      }
                      if (local_1a0[0] != local_190) {
                        operator_delete(local_1a0[0],local_190[0] + 1);
                      }
                      pTVar14 = (TriangleCaseBase *)operator_new(0xa0);
                      TriangleCaseBase::TriangleCaseBase
                                (pTVar14,(local_2f8->super_TestCaseGroup).m_context,
                                 (char *)local_2e8.p0.m_data._0_8_,"clip three vertices",&local_3c8,
                                 &local_368,
                                 (WindowRectangle *)(anonymous_namespace)::VIEWPORT_CENTER);
                      (pTVar14->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.
                      _vptr_TestNode = (_func_int **)&PTR__TriangleCaseBase_00d0cf60;
                      tcu::TestNode::addChild(local_180,(TestNode *)pTVar14);
                      if ((Vec4 *)local_2e8.p0.m_data._0_8_ != &local_2e8.c0) {
                        operator_delete((void *)local_2e8.p0.m_data._0_8_,
                                        local_2e8.c0.m_data._0_8_ + 1);
                      }
                    }
                  }
                }
              }
            }
            lVar23 = lVar23 + 1;
            bVar24 = uVar21 < 0x19;
            uVar21 = uVar21 + 1;
          } while (bVar24);
        }
        local_218 = local_218 + 1;
        local_268 = local_268 + 1;
        local_288 = (long *)((long)local_288 + 1);
      } while ((undefined1 *)local_268 != local_2f0);
    }
    local_368.p1.m_data._0_8_ = local_368.p1.m_data._0_8_ + 1;
    local_1e8 = local_1e8 + 1;
    local_1f0 = local_1f0 + 1;
    local_2f0 = (undefined1 *)((long)local_2f0 + -1);
  } while (local_368.p1.m_data._0_8_ != 0x1a);
  return 0x1a;
}

Assistant:

void PolyVertexClipTestGroup::init (void)
{
	const float far = 30000.0f;
	const tcu::IVec3 outside[] =
	{
		// outside one clipping plane
		tcu::IVec3(-1,  0,  0),
		tcu::IVec3( 1,  0,  0),
		tcu::IVec3( 0,  1,  0),
		tcu::IVec3( 0, -1,  0),
		tcu::IVec3( 0,  0,  1),
		tcu::IVec3( 0,  0, -1),

		// outside two clipping planes
		tcu::IVec3(-1, -1,  0),
		tcu::IVec3( 1, -1,  0),
		tcu::IVec3( 1,  1,  0),
		tcu::IVec3(-1,  1,  0),

		tcu::IVec3(-1,  0, -1),
		tcu::IVec3( 1,  0, -1),
		tcu::IVec3( 1,  0,  1),
		tcu::IVec3(-1,  0,  1),

		tcu::IVec3( 0, -1, -1),
		tcu::IVec3( 0,  1, -1),
		tcu::IVec3( 0,  1,  1),
		tcu::IVec3( 0, -1,  1),

		// outside three clipping planes
		tcu::IVec3(-1, -1,  1),
		tcu::IVec3( 1, -1,  1),
		tcu::IVec3( 1,  1,  1),
		tcu::IVec3(-1,  1,  1),

		tcu::IVec3(-1, -1, -1),
		tcu::IVec3( 1, -1, -1),
		tcu::IVec3( 1,  1, -1),
		tcu::IVec3(-1,  1, -1),
	};

	de::Random rnd(0xabcdef);

	TestCaseGroup* clipOne		= new TestCaseGroup(m_context, "clip_one",		"Clip one vertex");
	TestCaseGroup* clipTwo		= new TestCaseGroup(m_context, "clip_two",		"Clip two vertices");
	TestCaseGroup* clipThree	= new TestCaseGroup(m_context, "clip_three",	"Clip three vertices");

	addChild(clipOne);
	addChild(clipTwo);
	addChild(clipThree);

	// Test 1 point clipped
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(outside); ++ndx)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::Vec3 r1		= tcu::Vec3(-0.3f,	-0.4f,	0);
		const tcu::Vec3 r2		= IVec3ToVec3(outside[ndx]) * far;
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(r1.x() * w1, r1.y() * w1, r1.z() * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(r2.x() * w2, r2.y() * w2, r2.z() * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx].x() > 0 ? "_pos_x" : (outside[ndx].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx].y() > 0 ? "_pos_y" : (outside[ndx].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx].z() > 0 ? "_pos_z" : (outside[ndx].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		// don't try to test with degenerate (or almost degenerate) triangles
		if (outside[ndx].x() == 0 && outside[ndx].y() == 0)
			continue;

		clipOne->addChild(new TriangleCase(m_context, name.c_str(), "clip one vertex", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Special triangles for "clip_z" cases, default triangles is not good, since it has very small visible area => problems with MSAA
	{
		const tcu::Vec4 white = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

		const TriangleCase::TriangleData posZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f, -0.9f, 1.0f), white,
			tcu::Vec4( 0.8f,  0.0f, -0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f,  3.0f, 1.0f), white
		};
		const TriangleCase::TriangleData negZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f,  0.9f, 1.0f), white,
			tcu::Vec4( 0.4f,  0.0f,  0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f, -3.0f, 1.0f), white
		};

		clipOne->addChild(new TriangleCase(m_context, "clip_pos_z", "clip one vertex", &posZTriangle, &posZTriangle + 1, VIEWPORT_CENTER));
		clipOne->addChild(new TriangleCase(m_context, "clip_neg_z", "clip one vertex", &negZTriangle, &negZTriangle + 1, VIEWPORT_CENTER));
	}

	// Test 2 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::IVec3 r1		= outside[ndx1];
		const tcu::IVec3 r2		= outside[ndx2];
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
			"_and" +
			(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		if (twoPointClippedTriangleInvisible(r0, r1, r2))
			continue;

		clipTwo->addChild(new TriangleCase(m_context, name.c_str(), "clip two vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Test 3 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	for (int ndx3 = ndx2 + 1; ndx3 < DE_LENGTH_OF_ARRAY(outside); ++ndx3)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(1, 1, 1, 1);
		const tcu::IVec3 r0		= outside[ndx1];
		const tcu::IVec3 r1		= outside[ndx2];
		const tcu::IVec3 r2		= outside[ndx3];
		const tcu::Vec4 p0		= tcu::Vec4(float(r0.x()) * far * w0, float(r0.y()) * far * w0, float(r0.z()) * far * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		// ignore cases where polygon is along xz or yz planes
		if (pointsOnLine(r0.swizzle(0, 1), r1.swizzle(0, 1), r2.swizzle(0, 1)))
			continue;

		// triangle is visible only if it intersects the origin
		if (pointOnTriangle(tcu::IVec3(0, 0, 0), r0, r1, r2))
		{
			const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};
			const std::string name	= std::string("clip") +
				(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx3].x() > 0 ? "_pos_x" : (outside[ndx3].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx3].y() > 0 ? "_pos_y" : (outside[ndx3].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx3].z() > 0 ? "_pos_z" : (outside[ndx3].z() < 0 ? "_neg_z" : ""));

			clipThree->addChild(new TriangleCase(m_context, name.c_str(), "clip three vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
		}
	}
}